

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_creature_abstract::update_read
          (cse_alife_creature_abstract *this,xr_packet *packet)

{
  float *value;
  
  value = &this->m_health;
  xr_packet::r<float>(packet,value);
  if (*(ushort *)&this->field_0x28 < 0x73) {
    *value = *value * 0.01;
  }
  xr_packet::r<unsigned_int>(packet,&this->m_timestamp);
  xr_packet::r<unsigned_char>(packet,&this->m_flags);
  xr_packet::r<xray_re::_vector3<float>>(packet,(_vector3<float> *)&this->field_0x60);
  xr_packet::r<float>(packet,&this->m_o_model);
  xr_packet::r<float>(packet,&(this->m_o_torso).yaw);
  xr_packet::r<float>(packet,&(this->m_o_torso).pitch);
  xr_packet::r<float>(packet,&(this->m_o_torso).roll);
  xr_packet::r<unsigned_char>(packet,&this->m_s_team);
  xr_packet::r<unsigned_char>(packet,&this->m_s_squad);
  xr_packet::r<unsigned_char>(packet,&this->m_s_group);
  return;
}

Assistant:

void cse_alife_creature_abstract::update_read(xr_packet& packet)
{
	cse_alife_dynamic_object_visual::update_read(packet);
	packet.r_float(m_health);
	if (m_version < CSE_VERSION_0x73)
		m_health *= 0.01f;
	packet.r_u32(m_timestamp);
	packet.r_u8(m_flags);
	packet.r_vec3(m_o_position);
	packet.r_float(m_o_model);
	packet.r_float(m_o_torso.yaw);
	packet.r_float(m_o_torso.pitch);
	packet.r_float(m_o_torso.roll);
	packet.r_u8(m_s_team);
	packet.r_u8(m_s_squad);
	packet.r_u8(m_s_group);
}